

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs7_test.cc
# Opt level: O2

void __thiscall PKCS7Test_CertReparseWindows_Test::TestBody(PKCS7Test_CertReparseWindows_Test *this)

{
  string local_28;
  
  GetTestData_abi_cxx11_(&local_28,"crypto/pkcs7/test/windows.p7c");
  TestCertReparse((Span<const_unsigned_char>)local_28._0_16_);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

TEST(PKCS7Test, CertReparseWindows) {
  // windows.p7c is the Equifax root certificate, as exported by Windows 7.
  TestCertReparse(
      bssl::StringAsBytes(GetTestData("crypto/pkcs7/test/windows.p7c")));
}